

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O0

data<Imath_3_2::half> * __thiscall
anon_unknown.dwarf_61d64::data<Imath_3_2::half>::operator<<
          (data<Imath_3_2::half> *this,end *param_2)

{
  vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
  *this_00;
  vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
  *pvVar1;
  ArgExc *pAVar2;
  size_type sVar3;
  size_type sVar4;
  data<Imath_3_2::half> *in_RDI;
  value_type *in_stack_ffffffffffffffc8;
  vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
  *in_stack_ffffffffffffffd0;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *in_stack_ffffffffffffffe0;
  
  if ((in_RDI->_inserting_result & 1U) == 0) {
    sVar3 = std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::size
                      (&in_RDI->_current_sample);
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&in_RDI->_channels);
    if (sVar3 != sVar4) {
      pAVar2 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc
                (pAVar2,"bug in test suite: cannot end sample: wrong number of values written");
      __cxa_throw(pAVar2,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    std::
    vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
    ::push_back(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::resize
              (in_stack_ffffffffffffffe0,(size_type)in_RDI);
  }
  else {
    this_00 = (vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
               *)std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::size
                           (&in_RDI->_current_result);
    pvVar1 = (vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
              *)std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&in_RDI->_channels);
    if (this_00 != pvVar1) {
      pAVar2 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc
                (pAVar2,"bug in test suite: cannot end result: wrong number of values written");
      __cxa_throw(pAVar2,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    std::
    vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
    ::push_back(this_00,in_stack_ffffffffffffffc8);
    std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::resize
              (in_stack_ffffffffffffffe0,(size_type)in_RDI);
    std::
    vector<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>,_std::allocator<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>_>_>
    ::push_back((vector<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>,_std::allocator<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>_>_>
                 *)this_00,(value_type *)in_stack_ffffffffffffffc8);
    std::
    vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
    ::resize((vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
              *)in_stack_ffffffffffffffe0,(size_type)in_RDI);
    in_RDI->_inserting_result = false;
  }
  return in_RDI;
}

Assistant:

data& operator<< (const end&)
    {
        if (_inserting_result)
        {
            if (_current_result.size () != _channels.size ())
            {
                throw IEX_NAMESPACE::ArgExc (
                    "bug in test suite: cannot end result: wrong number of values written");
            }
            _results.push_back (_current_result);
            _current_result.resize (0);

            //
            // also cause the current_samples to be written as the given number of pixels
            //
            _samples.push_back (_current_pixel);
            _current_pixel.resize (0);
            _inserting_result = false;
        }
        else
        {
            if (_current_sample.size () != _channels.size ())
            {
                throw IEX_NAMESPACE::ArgExc (
                    "bug in test suite: cannot end sample: wrong number of values written");
            }
            _current_pixel.push_back (_current_sample);
            _current_sample.resize (0);
        }
        return *this;
    }